

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

int4 __thiscall ActionPrototypeTypes::apply(ActionPrototypeTypes *this,Funcdata *data)

{
  PcodeOpBank *this_00;
  uint4 uVar1;
  pointer ppFVar2;
  AddrSpace *pAVar3;
  ProtoStore *pPVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int4 s;
  const_iterator cVar8;
  const_iterator cVar9;
  Varnode *pVVar10;
  undefined4 extraout_var;
  long *plVar11;
  long lVar12;
  Datatype *ct;
  undefined8 *puVar13;
  undefined8 *puVar14;
  PcodeOp *pPVar15;
  ProtoParameter *param;
  undefined4 extraout_var_04;
  ProtoModel *m;
  Funcdata *this_01;
  uint uVar16;
  ulong uVar17;
  BlockBasic *pBVar18;
  uint uVar19;
  Address local_50;
  AddrSpace *local_40;
  FuncProto *local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  m = data->glb->evalfp_current;
  if (m == (ProtoModel *)0x0) {
    m = data->glb->defaultfp;
  }
  if ((((data->funcp).flags & 4) == 0) && ((data->funcp).model != m)) {
    FuncProto::setModel(&data->funcp,m);
  }
  this_00 = &data->obank;
  local_38 = &data->funcp;
  cVar8 = PcodeOpBank::end(this_00,CPUI_RETURN);
  for (cVar9 = PcodeOpBank::begin(this_00,CPUI_RETURN); cVar9._M_node != cVar8._M_node;
      cVar9._M_node = (cVar9._M_node)->_M_next) {
    pPVar15 = (PcodeOp *)cVar9._M_node[1]._M_next;
    if (((pPVar15->flags & 0x20) == 0) &&
       (pVVar10 = *(pPVar15->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start, (pVVar10->flags & 2) == 0)) {
      pVVar10 = Funcdata::newConstant(data,pVVar10->size,0);
      Funcdata::opSetInput(data,pPVar15,pVVar10,0);
    }
  }
  iVar7 = (*((data->funcp).store)->_vptr_ProtoStore[9])();
  cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x30))
                    ((long *)CONCAT44(extraout_var,iVar7));
  if (cVar5 == '\0') {
    Funcdata::initActiveOutput(data);
  }
  else {
    iVar7 = (*((data->funcp).store)->_vptr_ProtoStore[9])();
    plVar11 = (long *)CONCAT44(extraout_var_00,iVar7);
    lVar12 = (**(code **)(*plVar11 + 0x18))(plVar11);
    if (*(int *)(lVar12 + 0x30) != 10) {
      for (cVar9 = PcodeOpBank::begin(this_00,CPUI_RETURN); cVar9._M_node != cVar8._M_node;
          cVar9._M_node = (cVar9._M_node)->_M_next) {
        pPVar15 = (PcodeOp *)cVar9._M_node[1]._M_next;
        if ((pPVar15->flags & 0x3e00020) == 0) {
          s = (**(code **)(*plVar11 + 0x28))(plVar11);
          (**(code **)(*plVar11 + 0x20))(&local_50,plVar11);
          pVVar10 = Funcdata::newVarnode(data,s,&local_50,(Datatype *)0x0);
          Funcdata::opInsertInput
                    (data,pPVar15,pVVar10,
                     (int4)((ulong)((long)(pPVar15->inrefs).
                                          super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pPVar15->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 3));
          ct = (Datatype *)(**(code **)(*plVar11 + 0x18))(plVar11);
          Varnode::updateType(pVVar10,ct,true,true);
        }
      }
    }
  }
  local_40 = (data->glb->super_AddrSpaceManager).defaultspace;
  if (((local_40->flags & 0x80) != 0) &&
     (ppFVar2 = (data->bblocks).list.super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     0 < (int)((ulong)((long)(data->bblocks).list.
                             super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)ppFVar2) >> 3))) {
    pAVar3 = (data->glb->super_AddrSpaceManager).stackspace;
    pBVar18 = (BlockBasic *)*ppFVar2;
    if ((pBVar18 != (BlockBasic *)0x0 && pAVar3 != (AddrSpace *)0x0) &&
       (iVar7 = (*pAVar3->_vptr_AddrSpace[2])(pAVar3), 0 < iVar7)) {
      uVar17 = 0;
      do {
        iVar7 = (*pAVar3->_vptr_AddrSpace[4])(pAVar3,uVar17);
        puVar13 = (undefined8 *)CONCAT44(extraout_var_01,iVar7);
        iVar7 = (*pAVar3->_vptr_AddrSpace[3])(pAVar3,uVar17);
        puVar14 = (undefined8 *)CONCAT44(extraout_var_02,iVar7);
        local_50.base = (AddrSpace *)*puVar14;
        local_50.offset = puVar14[1];
        pVVar10 = Funcdata::newVarnode(data,*(int4 *)(puVar14 + 2),&local_50,(Datatype *)0x0);
        pVVar10 = Funcdata::setInputVarnode(data,pVVar10);
        (*(pBVar18->super_FlowBlock)._vptr_FlowBlock[2])(&local_50,pBVar18);
        pPVar15 = Funcdata::newOp(data,1,&local_50);
        local_50.base = (AddrSpace *)*puVar13;
        local_50.offset = puVar13[1];
        Funcdata::newVarnodeOut(data,*(int4 *)(puVar13 + 2),&local_50,pPVar15);
        Funcdata::opSetOpcode(data,pPVar15,CPUI_INT_ZEXT);
        Funcdata::opSetInput(data,pPVar15,pVVar10,0);
        Funcdata::opInsertBegin(data,pPVar15,pBVar18);
        uVar16 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar16;
        iVar7 = (*pAVar3->_vptr_AddrSpace[2])(pAVar3);
      } while ((int)uVar16 < iVar7);
    }
  }
  bVar6 = FuncProto::isInputLocked(local_38);
  if (bVar6) {
    uVar1 = 0;
    if ((local_40->flags & 0x80) != 0) {
      uVar1 = local_40->addressSize;
    }
    ppFVar2 = (data->bblocks).list.super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(data->bblocks).list.
                            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppFVar2) >> 3) < 1) {
      pBVar18 = (BlockBasic *)0x0;
    }
    else {
      pBVar18 = (BlockBasic *)*ppFVar2;
    }
    uVar16 = (*((data->funcp).store)->_vptr_ProtoStore[5])();
    if (0 < (int)uVar16) {
      uVar17 = 0;
      do {
        pPVar4 = (data->funcp).store;
        iVar7 = (*pPVar4->_vptr_ProtoStore[6])(pPVar4,uVar17);
        param = (ProtoParameter *)CONCAT44(extraout_var_03,iVar7);
        iVar7 = (*param->_vptr_ProtoParameter[5])(param);
        (*param->_vptr_ProtoParameter[4])(&local_50,param);
        pVVar10 = Funcdata::newVarnode(data,iVar7,&local_50,(Datatype *)0x0);
        this_01 = data;
        pVVar10 = Funcdata::setInputVarnode(data,pVVar10);
        if (pBVar18 != (BlockBasic *)0x0) {
          extendInput((ActionPrototypeTypes *)this_01,data,pVVar10,param,pBVar18);
        }
        if (0 < (int)uVar1) {
          iVar7 = (*param->_vptr_ProtoParameter[3])(param);
          if ((*(int *)(CONCAT44(extraout_var_04,iVar7) + 0x30) == 2) &&
             (*(uint4 *)(CONCAT44(extraout_var_04,iVar7) + 8) == uVar1)) {
            *(byte *)&pVVar10->addlflags = (byte)pVVar10->addlflags | 0x20;
          }
        }
        uVar19 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar19;
      } while (uVar16 != uVar19);
    }
  }
  return 0;
}

Assistant:

int4 ActionPrototypeTypes::apply(Funcdata &data)

{
  int4 i;
  PcodeOp *op;
  Varnode *vn;
  list<PcodeOp *>::const_iterator iter,iterend;

  // Set the evalutation prototype if we are not already locked
  ProtoModel *evalfp = data.getArch()->evalfp_current;
  if (evalfp == (ProtoModel *)0)
    evalfp = data.getArch()->defaultfp;
  if ((!data.getFuncProto().isModelLocked())&&(!data.getFuncProto().hasMatchingModel(evalfp)))
    data.getFuncProto().setModel(evalfp);

  iterend = data.endOp(CPUI_RETURN);

				// Strip the indirect register from all RETURN ops
				// (Because we don't want to see this compiler
				// mechanism in the high-level C output)
  for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
    op = *iter;
    if (op->isDead()) continue;
    if (!op->getIn(0)->isConstant()) {
      vn = data.newConstant(op->getIn(0)->getSize(),0);
      data.opSetInput(op,vn,0);
    }
  }
  
  if (data.getFuncProto().isOutputLocked()) {
    ProtoParameter *outparam = data.getFuncProto().getOutput();
    if (outparam->getType()->getMetatype() != TYPE_VOID) {
      for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
	op = *iter;
	if (op->isDead()) continue;
	if (op->getHaltType() != 0) continue;
	vn = data.newVarnode(outparam->getSize(),outparam->getAddress());
	data.opInsertInput(op,vn,op->numInput());
	vn->updateType(outparam->getType(),true,true);
      }
    }
  }
  else
    data.initActiveOutput(); // Initiate gathering potential return values

  AddrSpace *spc = data.getArch()->getDefaultSpace();
  if (spc->isTruncated()) {
    // For truncated spaces we need a zext op, from the truncated stack pointer
    // into the full stack pointer
    AddrSpace *stackspc = data.getArch()->getStackSpace();
    BlockBasic *topbl = (BlockBasic *)0;
    if (data.getBasicBlocks().getSize() > 0)
      topbl = (BlockBasic *)data.getBasicBlocks().getBlock(0);
    if ((stackspc != (AddrSpace *)0)&&(topbl != (BlockBasic *)0)) {
      for(int4 i=0;i<stackspc->numSpacebase();++i) {
	const VarnodeData &fullReg( stackspc->getSpacebaseFull(i) );
	const VarnodeData &truncReg( stackspc->getSpacebase(i) );
	Varnode *invn = data.newVarnode( truncReg.size, truncReg.getAddr() );
	invn = data.setInputVarnode(invn);
	PcodeOp *extop = data.newOp(1,topbl->getStart());
	data.newVarnodeOut(fullReg.size,fullReg.getAddr(),extop);
	data.opSetOpcode(extop,CPUI_INT_ZEXT);
	data.opSetInput(extop,invn,0);
	data.opInsertBegin(extop,topbl);
      }
    }
  }

  // Force locked inputs to exist as varnodes

  // This is needed if we want to force a big input to exist
  // but only part of it is getting used. This is allows
  // a SUBPIECE instruction to get built with the big variable
  // as input and the part getting used as output.
  if (data.getFuncProto().isInputLocked()) {

    int4 ptr_size = spc->isTruncated() ? spc->getAddrSize() : 0; // Check if we need to do pointer trimming
    BlockBasic *topbl = (BlockBasic *)0;
    if (data.getBasicBlocks().getSize() > 0)
      topbl = (BlockBasic *)data.getBasicBlocks().getBlock(0);
    
    int4 numparams = data.getFuncProto().numParams();
    for(i=0;i<numparams;++i) {
      ProtoParameter *param = data.getFuncProto().getParam(i);
      Varnode *vn = data.newVarnode( param->getSize(), param->getAddress());
      vn = data.setInputVarnode(vn);
      if (topbl != (BlockBasic *)0)
	extendInput(data,vn,param,topbl);
      if (ptr_size > 0) {
	Datatype *ct = param->getType();
	if ((ct->getMetatype() == TYPE_PTR)&&(ct->getSize() == ptr_size))
	  vn->setPtrFlow();
      }
    }
  }
  return 0;
}